

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnImportGlobal
          (BinaryReaderObjdumpPrepass *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  char *pcVar1;
  string_view name;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  char *local_a8;
  size_type local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  string local_88;
  string_view local_68;
  string local_58;
  string_view local_38;
  
  local_68.size_ = field_name.size_;
  local_68.data_ = field_name.data_;
  local_38.size_ = module_name.size_;
  local_38.data_ = module_name.data_;
  string_view::to_string_abi_cxx11_(&local_58,&local_38);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_b8 = *puVar4;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar4;
    local_c8 = (ulong *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  string_view::to_string_abi_cxx11_(&local_88,&local_68);
  uVar5 = 0xf;
  if (local_c8 != &local_b8) {
    uVar5 = local_b8;
  }
  if (uVar5 < local_88._M_string_length + local_c0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar6 = local_88.field_2._M_allocated_capacity;
    }
    if (local_88._M_string_length + local_c0 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_c8);
      goto LAB_00126bd0;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88._M_dataplus._M_p);
LAB_00126bd0:
  local_a8 = (char *)&local_98;
  pcVar1 = (char *)(puVar3 + 2);
  if ((char *)*puVar3 == pcVar1) {
    local_98 = *(undefined8 *)pcVar1;
    uStack_90 = puVar3[3];
  }
  else {
    local_98 = *(undefined8 *)pcVar1;
    local_a8 = (char *)*puVar3;
  }
  local_a0 = puVar3[1];
  *puVar3 = pcVar1;
  puVar3[1] = 0;
  *pcVar1 = '\0';
  name.size_ = local_a0;
  name.data_ = local_a8;
  ObjdumpNames::Set(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->global_names,
                    global_index,name);
  if (local_a8 != (char *)&local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return (Result)Ok;
}

Assistant:

Result OnImportGlobal(Index import_index,
                        string_view module_name,
                        string_view field_name,
                        Index global_index,
                        Type type,
                        bool mutable_) override {
    SetGlobalName(global_index,
                  module_name.to_string() + "." + field_name.to_string());
    return Result::Ok;
  }